

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::(anonymous_namespace)::test<vk::Handle<(vk::HandleType)9>>
          (TestStatus *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context)

{
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  AllocationCallbackRecorder recordingAllocator;
  AllocationCallbackRecorder AStack_78;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&AStack_78,allocator,1);
  pDVar1 = Context::getDeviceInterface((Context *)this);
  pVVar2 = Context::getDevice((Context *)this);
  (*pDVar1->_vptr_DeviceInterface[0x26])(pDVar1,pVVar2,0,0);
  pDVar1 = Context::getDeviceInterface((Context *)this);
  pVVar2 = Context::getDevice((Context *)this);
  (*pDVar1->_vptr_DeviceInterface[0x26])
            (pDVar1,pVVar2,0,&AStack_78.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks
            );
  api::anon_unknown_1::reportStatus(__return_storage_ptr__,AStack_78.m_records.m_numElements == 0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&AStack_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	const Object					nullHandle			= DE_NULL;
	const VkAllocationCallbacks*	pNullAllocator		= DE_NULL;
	AllocationCallbackRecorder		recordingAllocator	(getSystemAllocator(), 1u);

	// Implementation should silently ignore a delete/free of a NULL handle.

	release(context, nullHandle, pNullAllocator);
	release(context, nullHandle, recordingAllocator.getCallbacks());

	return reportStatus(recordingAllocator.getNumRecords() == 0);
}